

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signmessage.cpp
# Opt level: O0

MessageVerificationResult MessageVerify(string *address,string *signature,string *message)

{
  undefined1 uVar1;
  bool bVar2;
  add_pointer_t<PKHash> ptVar3;
  long in_FS_OFFSET;
  __sv_type _Var4;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> signature_bytes;
  CPubKey pubkey;
  CTxDestination destination;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffea8;
  CTxDestination *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 uVar5;
  PKHash *this;
  undefined7 in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  MessageVerificationResult local_f4;
  string_view in_stack_ffffffffffffff20;
  PKHash local_58 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_58;
  DecodeDestination(in_stack_fffffffffffffed0);
  uVar1 = IsValidDestination(in_stack_fffffffffffffeb0);
  if ((bool)uVar1) {
    ptVar3 = std::
             get_if<PKHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                       (in_stack_fffffffffffffea8);
    if (ptVar3 == (add_pointer_t<PKHash>)0x0) {
      local_f4 = ERR_ADDRESS_NO_KEY;
    }
    else {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar1,in_stack_fffffffffffffec8));
      DecodeBase64(in_stack_ffffffffffffff20);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                         in_stack_fffffffffffffea8);
      if (bVar2) {
        CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffea8);
        MessageHash((string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator*
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffffea8);
        bVar2 = CPubKey::RecoverCompact
                          ((CPubKey *)_Var4._M_str,(uint256 *)_Var4._M_len,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(uVar1,in_stack_fffffffffffffec8));
        uVar5 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffebc);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          PKHash::PKHash(this,(CPubKey *)CONCAT44(uVar5,in_stack_fffffffffffffeb8));
          std::
          get_if<PKHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                    (in_stack_fffffffffffffea8);
          bVar2 = BaseHash<uint160>::operator==
                            ((BaseHash<uint160> *)CONCAT44(uVar5,in_stack_fffffffffffffeb8),
                             (BaseHash<uint160> *)in_stack_fffffffffffffeb0);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            local_f4 = OK;
          }
          else {
            local_f4 = ERR_NOT_SIGNED;
          }
        }
        else {
          local_f4 = ERR_PUBKEY_NOT_RECOVERED;
        }
      }
      else {
        local_f4 = ERR_MALFORMED_SIGNATURE;
      }
      std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
                ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                 in_stack_fffffffffffffea8);
    }
  }
  else {
    local_f4 = ERR_INVALID_ADDRESS;
  }
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_f4;
  }
  __stack_chk_fail();
}

Assistant:

MessageVerificationResult MessageVerify(
    const std::string& address,
    const std::string& signature,
    const std::string& message)
{
    CTxDestination destination = DecodeDestination(address);
    if (!IsValidDestination(destination)) {
        return MessageVerificationResult::ERR_INVALID_ADDRESS;
    }

    if (std::get_if<PKHash>(&destination) == nullptr) {
        return MessageVerificationResult::ERR_ADDRESS_NO_KEY;
    }

    auto signature_bytes = DecodeBase64(signature);
    if (!signature_bytes) {
        return MessageVerificationResult::ERR_MALFORMED_SIGNATURE;
    }

    CPubKey pubkey;
    if (!pubkey.RecoverCompact(MessageHash(message), *signature_bytes)) {
        return MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED;
    }

    if (!(PKHash(pubkey) == *std::get_if<PKHash>(&destination))) {
        return MessageVerificationResult::ERR_NOT_SIGNED;
    }

    return MessageVerificationResult::OK;
}